

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltests.c
# Opt level: O1

void checkobject(global_State *g,GCObject *o,int maybedead,int listage)

{
  byte bVar1;
  byte bVar2;
  short sVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  int iVar7;
  GCObject *pGVar8;
  GCObject *pGVar9;
  uint uVar10;
  GCObject *pGVar11;
  GCObject *pGVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  TValue *pTVar16;
  long lVar17;
  TValue *t;
  TValue *pTVar18;
  Value local_38;
  ushort local_30;
  
  bVar1 = o->marked;
  if (((g->currentwhite ^ 0x18) & bVar1) == 0) {
    if (((bVar1 & 0x18) == 0) && (g->gcstate == '\b')) {
      __assert_fail("g->gcstate != 8 || (((o)->marked) & (((1<<(3)) | (1<<(4)))))",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x19e,"void checkobject(global_State *, GCObject *, int, int)");
    }
    if (g->gckind == '\x01') {
      uVar10 = bVar1 & 7;
      if ((int)uVar10 < listage) {
        __assert_fail("((o)->marked & 7) >= listage",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a0,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (1 < uVar10 && (bVar1 & 0x18) != 0) {
        __assert_fail("!(((o)->marked) & (((1<<(3)) | (1<<(4))))) || !(((o)->marked & 7) > 1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a1,"void checkobject(global_State *, GCObject *, int, int)");
      }
      if (((((bVar1 & 0x20) == 0 && 1 < uVar10) && (uVar10 != 2)) && (uVar10 != 5)) &&
         (o->tt != '\b')) {
        __assert_fail("(((o)->marked) & ((1<<(5)))) || ((o)->marked & 7) == 5 || ((o)->marked & 7) == 2 || o->tt == 8"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x1a7,"void checkobject(global_State *, GCObject *, int, int)");
      }
    }
    bVar2 = o->tt;
    switch(bVar2) {
    case 4:
    case 0x14:
      if ((bVar1 & 0x38) == 0) {
        __assert_fail("!(!(((o)->marked) & (((1<<(3)) | (1<<(4))) | (1<<(5)))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x186,"void checkrefs(global_State *, GCObject *)");
      }
      break;
    case 5:
      if (9 < (bVar2 & 0xe)) {
        __assert_fail("(((h)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x102,"void checktable(global_State *, Table *)");
      }
      pTVar16 = (TValue *)((long)(1 << ((byte)o->field_0xb & 0x1f)) * 0x20 + *(long *)&o[1].tt);
      pGVar8 = *(GCObject **)&o[2].tt;
      if (pGVar8 != (GCObject *)0x0) {
        if (9 < (pGVar8->tt & 0xe)) {
          pcVar13 = "(((h->metatable)->tt) & 0x0F) < (9+1)";
LAB_00132ccd:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x103,"void checktable(global_State *, Table *)");
        }
        iVar7 = testobjref(g,o,pGVar8);
        if (iVar7 == 0) {
          pcVar13 = "0";
          goto LAB_00132ccd;
        }
      }
      if (*(int *)&o->field_0xc != 0) {
        lVar15 = 0;
        uVar14 = 0;
        do {
          checkvalref(g,o,(TValue *)((long)&(o[1].next)->next + lVar15));
          uVar14 = uVar14 + 1;
          lVar15 = lVar15 + 0x10;
        } while (uVar14 < *(uint *)&o->field_0xc);
      }
      if (*(TValue **)&o[1].tt < pTVar16) {
        t = *(TValue **)&o[1].tt + 1;
        do {
          if (t[-1].tt_ != 0) {
            if (t->tt_ == 0) {
              __assert_fail("!((((((const TValue*)((&(n)->i_key.tvk)))))->tt_) == (0))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x108,"void checktable(global_State *, Table *)");
            }
            checkvalref(g,o,t);
            checkvalref(g,o,t + -1);
          }
          pTVar18 = t + 1;
          t = t + 2;
        } while (pTVar18 < pTVar16);
      }
      break;
    case 6:
      if (9 < (bVar2 & 0xe)) {
        __assert_fail("(((cl)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x139,"void checkLclosure(global_State *, LClosure *)");
      }
      pGVar8 = *(GCObject **)&o[1].tt;
      if (pGVar8 != (GCObject *)0x0) {
        if (9 < (pGVar8->tt & 0xe)) {
          pcVar13 = "(((cl->p)->tt) & 0x0F) < (9+1)";
LAB_00132c8f:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x13b,"void checkLclosure(global_State *, LClosure *)");
        }
        iVar7 = testobjref(g,o,pGVar8);
        if (iVar7 == 0) {
          pcVar13 = "0";
          goto LAB_00132c8f;
        }
      }
      if (o->field_0xa != '\0') {
        uVar14 = 0;
        do {
          pGVar8 = (&o[2].next)[uVar14];
          if (pGVar8 != (GCObject *)0x0) {
            if (pGVar8->next == pGVar8 + 1) {
              checkvalref(g,o,(TValue *)pGVar8->next);
            }
            iVar5._0_1_ = pGVar8->tt;
            iVar5._1_1_ = pGVar8->marked;
            iVar5._2_2_ = *(undefined2 *)&pGVar8->field_0xa;
            if (iVar5 == 0) {
              __assert_fail("uv->refcount > 0",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x141,"void checkLclosure(global_State *, LClosure *)");
            }
          }
          uVar14 = uVar14 + 1;
        } while (uVar14 < (byte)o->field_0xa);
      }
      break;
    case 7:
      if (9 < (bVar2 & 0xe)) {
        __assert_fail("(((u)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x111,"void checkudata(global_State *, Udata *)");
      }
      pGVar8 = o[1].next;
      if (pGVar8 != (GCObject *)0x0) {
        if (9 < (pGVar8->tt & 0xe)) {
          pcVar13 = "(((mt)->tt) & 0x0F) < (9+1)";
LAB_00132cec:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x114,"void checkudata(global_State *, Udata *)");
        }
        iVar7 = testobjref(g,o,pGVar8);
        if (iVar7 == 0) {
          pcVar13 = "0";
          goto LAB_00132cec;
        }
      }
      local_38 = (Value)((Value *)(o + 2))->gc;
      local_30 = *(ushort *)&o->field_0xa;
      if (((short)local_30 < 0) &&
         (((local_30 & 0x7f) != (ushort)(local_38.gc)->tt ||
          ((g->mainthread != (lua_State *)0x0 &&
           (((local_38.gc)->marked & (g->mainthread->l_G->currentwhite ^ 0x18)) != 0)))))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x115,"void checkudata(global_State *, Udata *)");
      }
      checkvalref(g,o,(TValue *)&local_38);
      break;
    case 8:
      pGVar8 = *(GCObject **)&o[3].tt;
      if (pGVar8 == (GCObject *)0x0) {
        iVar7._0_1_ = o[0xb].tt;
        iVar7._1_1_ = o[0xb].marked;
        iVar7._2_2_ = *(undefined2 *)&o[0xb].field_0xa;
        if (((iVar7 != 0) || (o[4].next != (GCObject *)0x0)) || (o[2].next != (GCObject *)0x0)) {
          __assert_fail("L1->stacksize == 0 && L1->openupval == ((void*)0) && L1->ci == ((void*)0)",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x15c,"void checkstack(global_State *, lua_State *)");
        }
      }
      else {
        pGVar9 = o + 4;
        while (pGVar11 = pGVar9->next, pGVar11 != (GCObject *)0x0) {
          pGVar9 = pGVar11 + 1;
          if (pGVar11->next == pGVar9) {
            __assert_fail("((uv)->v != &(uv)->u.value)",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x160,"void checkstack(global_State *, lua_State *)");
          }
        }
        pGVar9 = o[2].next;
        if (pGVar9 != (GCObject *)0x0) {
          pGVar11 = pGVar9;
          do {
            if (o[3].next < *(GCObject **)&pGVar11->tt) {
              __assert_fail("ci->top <= L1->stack_last",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x162,"void checkstack(global_State *, lua_State *)");
            }
            if ((((ulong)pGVar11[4].next & 0x20000) != 0) &&
               (*(char *)((long)&pGVar11[4].next + 6) == '\0')) {
              if ((pGVar9 == pGVar11) && (o->field_0xa == '\x01')) {
                pGVar12 = (GCObject *)((long)&pGVar8->next + *(long *)&pGVar11[3].tt);
              }
              else {
                pGVar12 = pGVar11->next;
              }
              sVar3._0_1_ = pGVar12->tt;
              sVar3._1_1_ = pGVar12->marked;
              if (sVar3 != -0x7ffa) {
                pcVar13 = "((((f))->tt_) == (((((6) | ((0) << 4))) | (1 << 15))))";
LAB_00132b73:
                __assert_fail(pcVar13,
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                              ,0x14e,"int lua_checkpc(lua_State *, CallInfo *)");
              }
              if (pGVar12->next->tt != '\x06') {
                pcVar13 = "(((f)->value_).gc)->tt == ((6) | ((0) << 4))";
                goto LAB_00132b73;
              }
              lVar15 = *(long *)&pGVar12->next[1].tt;
              uVar14 = *(ulong *)(lVar15 + 0x38);
              uVar6._0_1_ = pGVar11[2].tt;
              uVar6._1_1_ = pGVar11[2].marked;
              uVar6._2_6_ = *(undefined6 *)&pGVar11[2].field_0xa;
              if ((uVar6 < uVar14) || (uVar14 + (long)*(int *)(lVar15 + 0x18) * 4 < uVar6)) {
                __assert_fail("lua_checkpc(L1, ci)",
                              "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                              ,0x163,"void checkstack(global_State *, lua_State *)");
              }
            }
            pGVar11 = pGVar11[1].next;
          } while (pGVar11 != (GCObject *)0x0);
        }
        for (; pGVar8 < o[3].next + 5; pGVar8 = pGVar8 + 1) {
          uVar4._0_1_ = pGVar8->tt;
          uVar4._1_1_ = pGVar8->marked;
          if (((short)uVar4 < 0) &&
             (((uVar4 & 0x7f) != (ushort)pGVar8->next->tt ||
              ((o != (GCObject *)0x0 &&
               ((pGVar8->next->marked & (*(byte *)(*(long *)&o[1].tt + 0x54) ^ 0x18)) != 0)))))) {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                          ,0x166,"void checkstack(global_State *, lua_State *)");
          }
        }
      }
      break;
    case 9:
      if (9 < (bVar2 & 0xe)) {
        __assert_fail("(((f)->tt) & 0x0F) < (9+1)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                      ,0x11f,"void checkproto(global_State *, Proto *)");
      }
      pGVar8 = o[6].next;
      if (pGVar8 != (GCObject *)0x0) {
        if (9 < (pGVar8->tt & 0xe)) {
          pcVar13 = "(((f->cache)->tt) & 0x0F) < (9+1)";
LAB_00132cae:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x120,"void checkproto(global_State *, Proto *)");
        }
        iVar7 = testobjref(g,o,pGVar8);
        if (iVar7 == 0) {
          pcVar13 = "0";
          goto LAB_00132cae;
        }
      }
      pGVar8 = *(GCObject **)&o[6].tt;
      if (pGVar8 != (GCObject *)0x0) {
        if (9 < (pGVar8->tt & 0xe)) {
          pcVar13 = "(((f->source)->tt) & 0x0F) < (9+1)";
LAB_00132d14:
          __assert_fail(pcVar13,
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                        ,0x121,"void checkproto(global_State *, Proto *)");
        }
        iVar7 = testobjref(g,o,pGVar8);
        if (iVar7 == 0) {
          pcVar13 = "0";
          goto LAB_00132d14;
        }
      }
      if (0 < *(int *)((long)&o[1].next + 4)) {
        lVar17 = 8;
        lVar15 = 0;
        do {
          if ((*(ushort *)((long)&(o[3].next)->next + lVar17) & 0xf) == 4) {
            pGVar8 = *(GCObject **)((long)o[3].next + lVar17 + -8);
            if ((pGVar8->tt & 0xf) != 4) {
              pcVar13 = "(((((f->k + i)->value_).gc)->tt) & 0x0F) == 4";
LAB_00132acf:
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x124,"void checkproto(global_State *, Proto *)");
            }
            if ((pGVar8 != (GCObject *)0x0) && (iVar7 = testobjref(g,o,pGVar8), iVar7 == 0)) {
              pcVar13 = "0";
              goto LAB_00132acf;
            }
          }
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 0x10;
        } while (lVar15 < *(int *)((long)&o[1].next + 4));
      }
      if (0 < *(int *)&o[1].next) {
        lVar17 = 0;
        lVar15 = 0;
        do {
          pGVar8 = *(GCObject **)(*(long *)&o[5].tt + lVar17);
          if (pGVar8 != (GCObject *)0x0) {
            if (9 < (pGVar8->tt & 0xe)) {
              pcVar13 = "(((f->upvalues[i].name)->tt) & 0x0F) < (9+1)";
LAB_001329fa:
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x127,"void checkproto(global_State *, Proto *)");
            }
            iVar7 = testobjref(g,o,pGVar8);
            if (iVar7 == 0) {
              pcVar13 = "0";
              goto LAB_001329fa;
            }
          }
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 0x18;
        } while (lVar15 < *(int *)&o[1].next);
      }
      if (0 < *(int *)&o[2].next) {
        lVar15 = 0;
        do {
          pGVar8 = (&(o[4].next)->next)[lVar15];
          if (pGVar8 != (GCObject *)0x0) {
            if (9 < (pGVar8->tt & 0xe)) {
              pcVar13 = "(((f->p[i])->tt) & 0x0F) < (9+1)";
LAB_00132a41:
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,0x129,"void checkproto(global_State *, Proto *)");
            }
            iVar7 = testobjref(g,o,pGVar8);
            if (iVar7 == 0) {
              pcVar13 = "0";
              goto LAB_00132a41;
            }
          }
          lVar15 = lVar15 + 1;
        } while (lVar15 < *(int *)&o[2].next);
      }
      if (0 < *(int *)((long)&o[2].next + 4)) {
        lVar17 = 0;
        lVar15 = 0;
        do {
          pGVar8 = *(GCObject **)((long)&(o[5].next)->next + lVar17);
          if (pGVar8 != (GCObject *)0x0) {
            if (9 < (pGVar8->tt & 0xe)) {
              pcVar13 = "(((f->locvars[i].varname)->tt) & 0x0F) < (9+1)";
LAB_00132a69:
              __assert_fail(pcVar13,
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                            ,299,"void checkproto(global_State *, Proto *)");
            }
            iVar7 = testobjref(g,o,pGVar8);
            if (iVar7 == 0) {
              pcVar13 = "0";
              goto LAB_00132a69;
            }
          }
          lVar15 = lVar15 + 1;
          lVar17 = lVar17 + 0x20;
        } while (lVar15 < *(int *)((long)&o[2].next + 4));
      }
      break;
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x11:
    case 0x12:
    case 0x13:
switchD_0013246b_caseD_a:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                    ,0x189,"void checkrefs(global_State *, GCObject *)");
    default:
      if (bVar2 != 0x26) goto switchD_0013246b_caseD_a;
      if (o->field_0xa != '\0') {
        pGVar8 = o + 2;
        uVar14 = 0;
        do {
          checkvalref(g,o,(TValue *)pGVar8);
          uVar14 = uVar14 + 1;
          pGVar8 = pGVar8 + 1;
        } while (uVar14 < (byte)o->field_0xa);
      }
    }
  }
  else if (maybedead == 0) {
    __assert_fail("maybedead",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/ltests.c"
                  ,0x19c,"void checkobject(global_State *, GCObject *, int, int)");
  }
  return;
}

Assistant:

static void checkobject (global_State *g, GCObject *o, int maybedead,
                         int listage) {
  if (isdead(g, o))
    lua_assert(maybedead);
  else {
    lua_assert(g->gcstate != GCSpause || iswhite(o));
    if (g->gckind == KGC_GEN) {  /* generational mode? */
      lua_assert(getage(o) >= listage);
      lua_assert(!iswhite(o) || !isold(o));
      if (isold(o)) {
        lua_assert(isblack(o) ||
        getage(o) == G_TOUCHED1 ||
        getage(o) == G_OLD0 ||
        o->tt == LUA_TTHREAD /* ||
        (o->tt == LUA_TUPVAL && upisopen(gco2upv(o)))*/);
      }
    }
    checkrefs(g, o);
  }
}